

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightBounds> * __thiscall
pbrt::DiffuseAreaLight::Bounds
          (optional<pbrt::LightBounds> *__return_storage_ptr__,DiffuseAreaLight *this)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  bool bVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  long lVar7;
  int c;
  int c_00;
  int x;
  ulong uVar8;
  Float FVar9;
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  Vector3<float> VVar12;
  float local_a4;
  WrapMode2D local_80;
  undefined8 local_78;
  ulong uStack_70;
  undefined8 local_68;
  DirectionCone nb;
  undefined8 local_48;
  ulong uStack_40;
  undefined8 local_38;
  
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    local_a4 = DenselySampledSpectrum::MaxValue(&this->Lemit);
  }
  else {
    TVar6 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    local_a4 = 0.0;
    for (lVar7 = 0; lVar7 < (long)TVar6 >> 0x20; lVar7 = lVar7 + 1) {
      for (uVar8 = 0; (long)uVar8 < (long)TVar6.x; uVar8 = uVar8 + 1) {
        for (c_00 = 0; c_00 != 3; c_00 = c_00 + 1) {
          WrapMode2D::WrapMode2D(&local_80,Clamp);
          FVar9 = Image::GetChannel(&this->image,(Point2i)(lVar7 << 0x20 | uVar8),c_00,local_80);
          local_a4 = local_a4 + FVar9;
        }
        TVar6 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
      }
    }
    local_a4 = local_a4 / (float)(TVar6.x * TVar6.y * 3);
  }
  bVar1 = this->twoSided;
  fVar2 = this->scale;
  fVar3 = this->area;
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  ::Dispatch<pbrt::ShapeHandle::NormalBounds()const::_lambda(auto:1)_1_>
            (&nb,(TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
                  *)&this->shape);
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  ::Dispatch<pbrt::ShapeHandle::Bounds()const::_lambda(auto:1)_1_>
            (&local_48,
             (TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
              *)&this->shape);
  bVar5 = this->twoSided;
  local_68 = local_38;
  auVar11 = ZEXT856(uStack_40);
  local_78 = local_48;
  uStack_70 = uStack_40;
  VVar12 = Normalize<float>(&nb.w);
  auVar10._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar11;
  __return_storage_ptr__->set = true;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_68;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = local_78;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) = uStack_70;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
       local_a4 *
       (float)((uint)(bVar1 & 1) * 0x40000000 + (uint)!(bool)(bVar1 & 1) * 0x3f800000) * fVar2 *
       fVar3 * 3.1415927;
  uVar4 = vmovlps_avx(auVar10._0_16_);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar4;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) =
       VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = nb.cosTheta;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x2c) = 0xb33bbd2e;
  (__return_storage_ptr__->optionalValue).__data[0x30] = bVar5;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightBounds> DiffuseAreaLight::Bounds() const {
    // Compute _phi_ for diffuse area light bounds
    Float phi = 0;
    if (image) {
        // Compute average _DiffuseAreaLight_ image channel value
        // Assume no distortion in the mapping, FWIW...
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x)
                for (int c = 0; c < 3; ++c)
                    phi += image.GetChannel({x, y}, c);
        phi /= 3 * image.Resolution().x * image.Resolution().y;

    } else
        phi = Lemit.MaxValue();
    phi *= scale * (twoSided ? 2 : 1) * area * Pi;

    DirectionCone nb = shape.NormalBounds();
    return LightBounds(shape.Bounds(), nb.w, phi, nb.cosTheta, std::cos(Pi / 2),
                       twoSided);
}